

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O1

void init_fdtd_3D_medium(fdtd3D *fdtd,init_medium_fun_3D permeability_invR,
                        init_medium_fun_3D permittivity_invR,void *user)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  double dVar8;
  float_type fVar9;
  double dVar10;
  double dVar11;
  void *local_80;
  void *local_78;
  
  if (fdtd->sizeX != 0) {
    local_78 = fdtd->permittivity_inv;
    local_80 = fdtd->permeability_inv;
    lVar2 = fdtd->sizeY * fdtd->sizeZ * 8;
    lVar1 = fdtd->sizeZ * 8;
    dVar8 = 0.0;
    uVar3 = 0;
    do {
      if (fdtd->sizeY != 0) {
        dVar11 = 0.0;
        uVar4 = 0;
        pvVar5 = local_80;
        pvVar6 = local_78;
        do {
          if (fdtd->sizeZ != 0) {
            dVar10 = 0.0;
            uVar7 = 0;
            do {
              fVar9 = (*permeability_invR)(dVar8,dVar11,dVar10,user);
              *(double *)((long)pvVar5 + uVar7 * 8) = 1.0 / (fVar9 * 1.2566370614359173e-06);
              fVar9 = (*permittivity_invR)(dVar8,dVar11,dVar10,user);
              *(double *)((long)pvVar6 + uVar7 * 8) = 1.0 / (fVar9 * 8.85418781762039e-12);
              uVar7 = uVar7 + 1;
              dVar10 = dVar10 + fdtd->dz;
            } while (uVar7 < fdtd->sizeZ);
          }
          uVar4 = uVar4 + 1;
          dVar11 = dVar11 + fdtd->dy;
          pvVar6 = (void *)((long)pvVar6 + lVar1);
          pvVar5 = (void *)((long)pvVar5 + lVar1);
        } while (uVar4 < fdtd->sizeY);
      }
      uVar3 = uVar3 + 1;
      dVar8 = dVar8 + fdtd->dx;
      local_78 = (void *)((long)local_78 + lVar2);
      local_80 = (void *)((long)local_80 + lVar2);
    } while (uVar3 < fdtd->sizeX);
  }
  return;
}

Assistant:

void init_fdtd_3D_medium(struct fdtd3D *fdtd,
                         init_medium_fun_3D permeability_invR,
                         init_medium_fun_3D permittivity_invR, void *user) {
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permittivity_inv, fdtd->permittivity_inv);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permeability_inv, fdtd->permeability_inv);
  float_type posX = float_cst(0.);
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i, posX += fdtd->dx) {
    float_type posY = float_cst(0.);
    for (uintmax_t j = 0; j < fdtd->sizeY; ++j, posY += fdtd->dy) {
      float_type posZ = float_cst(0.);
      for (uintmax_t k = 0; k < fdtd->sizeZ; ++k, posZ += fdtd->dz) {
        permeability_inv[i][j][k] =
            float_cst(1.) / (permeability_invR(posX, posY, posZ, user) * mu0);
        permittivity_inv[i][j][k] =
            float_cst(1.) / (permittivity_invR(posX, posY, posZ, user) * eps0);
      }
    }
  }
}